

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcache.c
# Opt level: O2

void duckdb_je_tcache_bin_flush_small
               (tsd_t *tsd,tcache_t *tcache,cache_bin_t *cache_bin,szind_t binind,uint rem)

{
  bin_t *batcher;
  size_t *psVar1;
  undefined8 *puVar2;
  ulong *puVar3;
  uint64_t *puVar4;
  char cVar5;
  uint uVar6;
  edata_t *peVar7;
  uint64_t uVar8;
  emap_batch_lookup_result_t eVar9;
  void *pvVar10;
  szind_t sVar11;
  bin_t *pbVar12;
  ticker_geom_t *ticker;
  void **ppvVar13;
  edata_list_active_t eVar14;
  _Bool _Var15;
  uint uVar16;
  long lVar17;
  size_t sVar18;
  size_t sVar19;
  long lVar20;
  ulong uVar21;
  bin_t *pbVar22;
  uint uVar23;
  pthread_mutex_t *ppVar24;
  size_t sVar25;
  cache_bin_sz_t nflushed;
  cache_bin_sz_t extraout_DX;
  undefined8 extraout_RDX;
  ulong uVar26;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar27;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  edata_t *slab;
  long *plVar28;
  arena_t *paVar29;
  uint uVar30;
  uint uVar31;
  pthread_mutex_t *ppVar32;
  uint uVar33;
  long lVar34;
  bool bVar35;
  long local_228 [33];
  bin_t *local_120;
  ticker_geom_t *local_118;
  uint64_t *local_110;
  ulong local_108;
  undefined1 *local_100;
  tcache_t *local_f8;
  long local_f0;
  cache_bin_ptr_array_t *local_e8;
  cache_bin_ptr_array_t local_e0;
  uint32_t *local_d0;
  ulong local_c8;
  uint local_bc;
  long local_b8;
  pthread_mutex_t *local_b0;
  arena_t *local_a8;
  ulong local_a0;
  ulong local_98;
  cache_bin_t *local_90;
  edata_list_active_t local_88;
  edata_list_active_t dalloc_slabs_extra;
  uint local_34;
  
  ppVar32 = (pthread_mutex_t *)0x1;
  local_f8 = tcache;
  duckdb_je_tcache_bin_flush_stashed(tsd,tcache,cache_bin,binind,true);
  uVar31 = *(int *)&cache_bin->low_bits_empty - (int)cache_bin->stack_head & 0xffff;
  uVar30 = uVar31 >> 3;
  if (uVar30 < (rem & 0xffff)) {
    rem = uVar30;
  }
  uVar30 = uVar30 - rem & 0xffff;
  local_e8 = (cache_bin_ptr_array_t *)(ulong)uVar30;
  local_f0 = (long)cache_bin->stack_head + ((ulong)uVar31 - (ulong)(uVar30 * 8));
  local_a0 = (ulong)binind;
  local_d0 = &duckdb_je_bin_infos[local_a0].nregs;
  local_118 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_arena_decay_ticker;
  local_110 = &tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_prng_state;
  uVar21 = 0;
  local_100 = (undefined1 *)local_228;
  local_90 = cache_bin;
  do {
    uVar30 = (int)local_e8 - (int)uVar21;
    if (0xff < uVar30) {
      uVar30 = 0x100;
    }
    local_e0.n = (cache_bin_sz_t)uVar30;
    local_e0.ptr = (void **)(local_f0 + uVar21 * 8);
    local_a8 = local_f8->tcache_slow->arena;
    local_bc = (uint)(tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_binshards).binshard
                     [local_a0];
    uVar26 = (ulong)(uVar30 * 8 + 0x17 & 0x1ff0);
    ppVar24 = (pthread_mutex_t *)(local_100 + -uVar26);
    local_108 = uVar21;
    local_b0 = ppVar24;
    ((emap_batch_lookup_result_t *)((long)ppVar24 - 8))->edata = (edata_t *)0x1fa63b2;
    tcache_bin_flush_edatas_lookup
              (tsd,&local_e0,uVar30,(size_t)ppVar24,(emap_batch_lookup_result_t *)ppVar32);
    lVar17 = (long)ppVar24 - uVar26;
    local_88.head.qlh_first = (anon_struct_8_1_803fbc3e_for_head)(edata_t *)0x0;
    uVar21 = 0;
    local_98 = 0;
    uVar27 = extraout_RDX;
    uVar31 = 0;
    local_b8 = lVar17;
    while (ppvVar13 = local_e0.ptr, sVar11 = duckdb_je_bin_info_nbatched_sizes,
          local_34 = (uint)uVar21, uVar31 < uVar30) {
      uVar21 = (ulong)uVar31;
      peVar7 = ((emap_batch_lookup_result_t *)((long)local_b0 + uVar21 * 8))->edata;
      uVar23 = (uint)peVar7->e_bits;
      paVar29 = (arena_t *)duckdb_je_arenas[uVar23 & 0xfff].repr;
      if (paVar29 == (arena_t *)0x0) {
        paVar29 = (arena_t *)0x0;
      }
      uVar16 = (uint)(peVar7->e_bits >> 0x26) & 0x3f;
      uVar6 = duckdb_je_arena_bin_offsets[local_a0];
      ppVar24 = (pthread_mutex_t *)(ulong)(uVar31 + 1);
      for (uVar26 = (ulong)(uVar31 + 1); uVar33 = (uint)ppVar24, uVar26 < uVar30;
          uVar26 = uVar26 + 1) {
        peVar7 = ((emap_batch_lookup_result_t *)((long)local_b0 + uVar26 * 8))->edata;
        uVar8 = peVar7->e_bits;
        if ((((uVar23 ^ (uint)uVar8) & 0xfff) == 0) && (((uint)(uVar8 >> 0x26) & 0x3f) == uVar16)) {
          eVar9 = *(emap_batch_lookup_result_t *)((long)local_b0 + (long)ppVar24 * 8);
          ((emap_batch_lookup_result_t *)((long)local_b0 + (long)ppVar24 * 8))->edata = peVar7;
          *(emap_batch_lookup_result_t *)((long)local_b0 + uVar26 * 8) = eVar9;
          pvVar10 = local_e0.ptr[(long)ppVar24];
          local_e0.ptr[(long)ppVar24] = local_e0.ptr[uVar26];
          local_e0.ptr[uVar26] = pvVar10;
          ppVar24 = (pthread_mutex_t *)(ulong)(uVar33 + 1);
        }
      }
      local_120 = (bin_t *)((long)&paVar29->nthreads[(ulong)uVar16 * 0xa2].repr + (ulong)uVar6);
      pbVar22 = (bin_t *)((long)&paVar29->nthreads[0].repr + (ulong)(uVar16 << 8) + (ulong)uVar6);
      if (binind < sVar11) {
        pbVar22 = local_120;
      }
      local_c8 = (ulong)(uVar33 - uVar31);
      if ((uVar16 == local_bc && paVar29 == local_a8 || sVar11 <= binind) ||
          duckdb_je_opt_bin_info_remote_free_max_batch < local_c8) {
        *(undefined8 *)(lVar17 + -8) = 0x1fa6517;
        malloc_mutex_lock((tsdn_t *)tsd,&pbVar22->lock);
LAB_01fa65c3:
        ppVar32 = local_b0;
        ppvVar13 = local_e0.ptr;
        if ((paVar29 == local_a8) && ((local_98 & 1) == 0)) {
          puVar4 = &(pbVar22->stats).nflushes;
          *puVar4 = *puVar4 + 1;
          uVar8 = (local_90->tstats).nrequests;
          puVar4 = &(pbVar22->stats).nrequests;
          *puVar4 = *puVar4 + uVar8;
          (local_90->tstats).nrequests = 0;
          local_98 = CONCAT71((int7)(uVar8 >> 8),1);
        }
        dalloc_slabs_extra.head.qlh_first._4_4_ = 0;
        dalloc_slabs_extra.head.qlh_first._0_4_ = duckdb_je_arena_binind_div_info[local_a0].magic;
        for (lVar34 = 0; pbVar12 = local_120, (pthread_mutex_t *)(uVar21 + lVar34) < ppVar24;
            lVar34 = lVar34 + 1) {
          peVar7 = *(edata_t **)((long)ppVar32 + lVar34 * 8 + uVar21 * 8);
          uVar26 = ((long)ppvVar13[uVar21 + lVar34] - (long)peVar7->e_addr) *
                   (long)dalloc_slabs_extra.head.qlh_first;
          *(undefined8 *)(lVar17 + -8) = 1;
          puVar3 = (ulong *)((long)&peVar7->field_6 + (uVar26 >> 0x26) * 8);
          *puVar3 = *puVar3 ^ *(long *)(lVar17 + -8) << ((byte)(uVar26 >> 0x20) & 0x3f);
          uVar26 = peVar7->e_bits + 0x10000000;
          peVar7->e_bits = uVar26;
          uVar31 = (uint)(uVar26 >> 0x1c) & 0x3ff;
          if (uVar31 == *local_d0) {
            *(undefined8 *)(lVar17 + -8) = 0x1fa66ab;
            duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                      ((tsdn_t *)tsd,paVar29,peVar7,pbVar22);
            if (local_34 < uVar30) {
              *(edata_t **)(local_b8 + (ulong)local_34 * 8) = peVar7;
              local_34 = local_34 + 1;
            }
            else {
              *(undefined8 *)(lVar17 + -8) = 0x1fa66f6;
              edata_list_active_append(&local_88,peVar7);
            }
          }
          else if ((uVar31 == 1) && (pbVar22->slabcur != peVar7)) {
            *(undefined8 *)(lVar17 + -8) = 0x1fa66e8;
            duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                      ((tsdn_t *)tsd,paVar29,peVar7,pbVar22);
          }
        }
        if (binind < sVar11) {
          batcher = local_120 + 1;
          *(undefined8 *)(lVar17 + -8) = 0x1fa672b;
          sVar18 = duckdb_je_batcher_pop_begin((tsdn_t *)tsd,(batcher_t *)batcher);
          if (sVar18 != 0xffffffffffffffff) {
            *(undefined8 *)(lVar17 + -8) = 0x1fa6746;
            sVar19 = duckdb_je_batcher_pop_get_pushes((tsdn_t *)tsd,(batcher_t *)batcher);
            lVar20 = 0;
            sVar25 = sVar18;
            while (bVar35 = sVar25 != 0, sVar25 = sVar25 - 1, bVar35) {
              puVar2 = (undefined8 *)((long)&pbVar12[1].stats.curregs + lVar20);
              uVar27 = puVar2[1];
              *(undefined8 *)((long)local_228 + lVar20) = *puVar2;
              *(undefined8 *)((long)local_228 + lVar20 + 8) = uVar27;
              lVar20 = lVar20 + 0x10;
            }
            *(undefined8 *)(lVar17 + -8) = 0x1fa6779;
            batcher_pop_end((tsdn_t *)tsd,(batcher_t *)batcher);
            plVar28 = local_228 + 1;
            for (lVar20 = 0; -lVar20 != sVar18; lVar20 = lVar20 + -1) {
              peVar7 = (edata_t *)*plVar28;
              uVar21 = (plVar28[-1] - (long)peVar7->e_addr) *
                       (long)dalloc_slabs_extra.head.qlh_first;
              *(undefined8 *)(lVar17 + -8) = 1;
              puVar3 = (ulong *)((long)&peVar7->field_6 + (uVar21 >> 0x26) * 8);
              *puVar3 = *puVar3 ^ *(long *)(lVar17 + -8) << ((byte)(uVar21 >> 0x20) & 0x3f);
              uVar21 = peVar7->e_bits + 0x10000000;
              peVar7->e_bits = uVar21;
              uVar31 = (uint)(uVar21 >> 0x1c) & 0x3ff;
              if (uVar31 == *local_d0) {
                *(undefined8 *)(lVar17 + -8) = 0x1fa67f8;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_empty
                          ((tsdn_t *)tsd,paVar29,peVar7,pbVar22);
                if (local_34 < uVar30) {
                  *(edata_t **)(local_b8 + (ulong)local_34 * 8) = peVar7;
                  local_34 = local_34 + 1;
                }
                else {
                  *(undefined8 *)(lVar17 + -8) = 0x1fa6843;
                  edata_list_active_append(&local_88,peVar7);
                }
              }
              else if ((uVar31 == 1) && (pbVar22->slabcur != peVar7)) {
                *(undefined8 *)(lVar17 + -8) = 0x1fa6835;
                duckdb_je_arena_dalloc_bin_locked_handle_newly_nonempty
                          ((tsdn_t *)tsd,paVar29,peVar7,pbVar22);
              }
              plVar28 = plVar28 + 2;
            }
            puVar4 = &(pbVar22->stats).batch_pops;
            *puVar4 = *puVar4 + 1;
            puVar4 = &(pbVar22->stats).batch_pushes;
            *puVar4 = *puVar4 + sVar19;
            puVar4 = &(pbVar22->stats).batch_pushed_elems;
            *puVar4 = *puVar4 + sVar18;
            lVar34 = lVar34 - lVar20;
          }
        }
        puVar4 = &(pbVar22->stats).ndalloc;
        *puVar4 = *puVar4 + lVar34;
        psVar1 = &(pbVar22->stats).curregs;
        *psVar1 = *psVar1 - lVar34;
        (pbVar22->lock).field_0.field_0.locked.repr = false;
        ppVar32 = (pthread_mutex_t *)((long)&(pbVar22->lock).field_0 + 0x48);
        *(undefined8 *)(lVar17 + -8) = 0x1fa6893;
        pthread_mutex_unlock(ppVar32);
        uVar27 = extraout_RDX_01;
      }
      else {
        *(undefined8 *)(lVar17 + -8) = 0x1fa6528;
        _Var15 = malloc_mutex_trylock((tsdn_t *)tsd,&pbVar22->lock);
        uVar26 = local_c8;
        if (!_Var15) goto LAB_01fa65c3;
        dalloc_slabs_extra.head.qlh_first =
             (anon_struct_8_1_803fbc3e_for_head)(anon_struct_8_1_803fbc3e_for_head)(pbVar22 + 1);
        *(undefined8 *)(lVar17 + -8) = 0x1fa6553;
        sVar18 = duckdb_je_batcher_push_begin((tsdn_t *)tsd,(batcher_t *)(pbVar22 + 1),uVar26);
        eVar14 = dalloc_slabs_extra;
        ppVar32 = local_b0;
        if (sVar18 == 0xffffffffffffffff) {
          *(undefined8 *)(lVar17 + -8) = 0x1fa65b7;
          malloc_mutex_lock((tsdn_t *)tsd,&pbVar22->lock);
          puVar4 = &(pbVar22->stats).batch_failed_pushes;
          *puVar4 = *puVar4 + 1;
          goto LAB_01fa65c3;
        }
        for (lVar34 = 0; uVar26 << 4 != lVar34; lVar34 = lVar34 + 0x10) {
          *(void **)((long)&pbVar22[1].stats.curregs + lVar34 + sVar18 * 0x10) = ppvVar13[uVar31];
          *(emap_batch_lookup_result_t *)((long)&pbVar22[1].stats.nfills + lVar34 + sVar18 * 0x10) =
               *(emap_batch_lookup_result_t *)((long)local_b0 + (ulong)uVar31 * 8);
          uVar31 = uVar31 + 1;
        }
        *(undefined8 *)(lVar17 + -8) = 0x1fa65a6;
        batcher_push_end((tsdn_t *)tsd,(batcher_t *)eVar14.head.qlh_first);
        uVar27 = extraout_RDX_00;
      }
      uVar26 = local_c8;
      puVar4 = local_110;
      ticker = local_118;
      uVar21 = (ulong)local_34;
      uVar31 = uVar33;
      if (tsd != (tsd_t *)0x0) {
        cVar5 = tsd->cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
        *(undefined8 *)(lVar17 + -8) = 0x1fa68d0;
        _Var15 = ticker_geom_ticks(ticker,puVar4,(int32_t)uVar26,'\0' < cVar5);
        uVar27 = extraout_RDX_02;
        ppVar32 = ppVar24;
        if (_Var15) {
          *(undefined8 *)(lVar17 + -8) = 0x1fa68f2;
          duckdb_je_arena_decay((tsdn_t *)tsd,paVar29,false,false);
          uVar27 = extraout_RDX_03;
          ppVar32 = ppVar24;
        }
      }
    }
    for (uVar26 = 0; uVar21 != uVar26; uVar26 = uVar26 + 1) {
      peVar7 = *(edata_t **)(local_b8 + uVar26 * 8);
      paVar29 = (arena_t *)duckdb_je_arenas[(uint)peVar7->e_bits & 0xfff].repr;
      *(undefined8 *)(lVar17 + -8) = 0x1fa6936;
      duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar29,peVar7);
      uVar27 = extraout_RDX_04;
    }
    while (eVar14.head.qlh_first = local_88.head.qlh_first, paVar29 = local_a8,
          nflushed = (cache_bin_sz_t)uVar27, local_88.head.qlh_first != (edata_t *)0x0) {
      *(undefined8 *)(lVar17 + -8) = 0x1fa6947;
      edata_list_active_remove(&local_88,(edata_t *)eVar14.head.qlh_first);
      paVar29 = (arena_t *)duckdb_je_arenas[*(uint *)eVar14.head.qlh_first & 0xfff].repr;
      *(undefined8 *)(lVar17 + -8) = 0x1fa6960;
      duckdb_je_arena_slab_dalloc((tsdn_t *)tsd,paVar29,(edata_t *)eVar14.head.qlh_first);
      uVar27 = extraout_RDX_05;
    }
    if ((local_98 & 1) == 0) {
      *(undefined8 *)(lVar17 + -8) = 0x1fa698a;
      pbVar22 = duckdb_je_arena_bin_choose((tsdn_t *)tsd,paVar29,binind,(uint *)0x0);
      *(undefined8 *)(lVar17 + -8) = 0x1fa6998;
      malloc_mutex_lock((tsdn_t *)tsd,&pbVar22->lock);
      puVar4 = &(pbVar22->stats).nflushes;
      *puVar4 = *puVar4 + 1;
      puVar4 = &(pbVar22->stats).nrequests;
      *puVar4 = *puVar4 + (local_90->tstats).nrequests;
      (local_90->tstats).nrequests = 0;
      (pbVar22->lock).field_0.field_0.locked.repr = false;
      *(undefined8 *)(lVar17 + -8) = 0x1fa69c6;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&(pbVar22->lock).field_0 + 0x48));
      nflushed = extraout_DX;
    }
    uVar21 = (ulong)(uVar30 + (int)local_108);
    if ((uint)local_e8 <= uVar30 + (int)local_108) {
      cache_bin_finish_flush(local_90,local_e8,nflushed);
      return;
    }
  } while( true );
}

Assistant:

void
tcache_bin_flush_small(tsd_t *tsd, tcache_t *tcache, cache_bin_t *cache_bin,
    szind_t binind, unsigned rem) {
	tcache_bin_flush_bottom(tsd, tcache, cache_bin, binind, rem,
	    /* small */ true);
}